

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  stbi__context *s;
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  stbi__uint32 sVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  char *pcVar9;
  long lVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long *in_FS_OFFSET;
  int *local_68;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar1 = stbi__get_marker(z);
  if (sVar1 != 0xd8) {
    lVar10 = *in_FS_OFFSET;
    pcVar9 = "no SOI";
    goto LAB_0014ea5b;
  }
  if (scan == 1) {
    return 1;
  }
  bVar2 = stbi__get_marker(z);
  while ((bVar2 != 0xc2 && ((bVar2 & 0xfe) != 0xc0))) {
    iVar3 = stbi__process_marker(z,(uint)bVar2);
    if (iVar3 == 0) {
      return 0;
    }
    while (bVar2 = stbi__get_marker(z), bVar2 == 0xff) {
      iVar3 = stbi__at_eof(z->s);
      if (iVar3 != 0) {
        lVar10 = *in_FS_OFFSET;
        pcVar9 = "no SOF";
        goto LAB_0014ea5b;
      }
    }
  }
  z->progressive = (uint)(bVar2 == 0xc2);
  s = z->s;
  uVar4 = stbi__get16be(s);
  if (uVar4 < 0xb) {
LAB_0014ea98:
    lVar10 = *in_FS_OFFSET;
    pcVar9 = "bad SOF len";
  }
  else {
    sVar1 = stbi__get8(s);
    if (sVar1 != '\b') {
      lVar10 = *in_FS_OFFSET;
      pcVar9 = "only 8-bit";
      goto LAB_0014ea5b;
    }
    sVar5 = stbi__get16be(s);
    s->img_y = sVar5;
    if (sVar5 == 0) {
      lVar10 = *in_FS_OFFSET;
      pcVar9 = "no header height";
      goto LAB_0014ea5b;
    }
    sVar5 = stbi__get16be(s);
    s->img_x = sVar5;
    if (sVar5 == 0) {
      lVar10 = *in_FS_OFFSET;
      pcVar9 = "0 width";
      goto LAB_0014ea5b;
    }
    if (0x1000000 < s->img_y) {
      lVar10 = *in_FS_OFFSET;
      pcVar9 = "too large";
      goto LAB_0014ea5b;
    }
    bVar2 = stbi__get8(s);
    if (bVar2 < 5) {
      if ((0x1aU >> (bVar2 & 0x1f) & 1) != 0) {
        s->img_n = (uint)bVar2;
        for (lVar10 = 0; (ulong)bVar2 * 0x60 - lVar10 != 0; lVar10 = lVar10 + 0x60) {
          *(undefined8 *)((long)&z->img_comp[0].data + lVar10) = 0;
          *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar10) = 0;
        }
        if (uVar4 == s->img_n * 3 + 8U) {
          z->rgb = 0;
          piVar12 = &z->img_comp[0].tq;
          lVar10 = 0;
          while (uVar4 = s->img_n, lVar10 < (int)uVar4) {
            bVar2 = stbi__get8(s);
            ((anon_struct_96_18_0d0905d3 *)(piVar12 + -3))->id = (uint)bVar2;
            if ((s->img_n == 3) &&
               (bVar2 == *(byte *)((long)&stbi__process_frame_header(stbi__jpeg*,int)::rgb + lVar10)
               )) {
              z->rgb = z->rgb + 1;
            }
            bVar2 = stbi__get8(s);
            piVar12[-2] = (uint)(bVar2 >> 4);
            if ((byte)(bVar2 + 0xb0) < 0xc0) goto LAB_0014ed28;
            piVar12[-1] = bVar2 & 0xf;
            if ((bVar2 & 0xf) - 5 < 0xfffffffc) goto LAB_0014ed10;
            bVar2 = stbi__get8(s);
            *piVar12 = (uint)bVar2;
            lVar10 = lVar10 + 1;
            piVar12 = piVar12 + 0x18;
            if (3 < bVar2) goto code_r0x0014ec51;
          }
          if (scan != 0) {
            return 1;
          }
          uVar14 = 0;
          iVar3 = stbi__mad3sizes_valid(s->img_x,s->img_y,uVar4,0);
          if (iVar3 == 0) {
            *(char **)(*in_FS_OFFSET + -0x20) = "too large";
            return 0;
          }
          uVar16 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar16 = uVar14;
          }
          uVar4 = 1;
          uVar13 = 1;
          for (; iVar3 = (int)uVar13, uVar16 * 0x60 - uVar14 != 0; uVar14 = uVar14 + 0x60) {
            uVar6 = *(uint *)((long)&z->img_comp[0].h + uVar14);
            uVar7 = *(uint *)((long)&z->img_comp[0].v + uVar14);
            if ((int)uVar4 < (int)uVar6) {
              uVar4 = uVar6;
            }
            if (iVar3 < (int)uVar7) {
              uVar13 = (ulong)uVar7;
            }
          }
          lVar10 = -0x60;
          do {
            if (uVar16 * 0x60 - (lVar10 + 0x60) == 0) {
              z->img_h_max = uVar4;
              z->img_v_max = iVar3;
              z->img_mcu_w = uVar4 * 8;
              z->img_mcu_h = iVar3 * 8;
              lVar10 = 0;
              uVar6 = ((s->img_x + uVar4 * 8) - 1) / (uVar4 * 8);
              z->img_mcu_x = uVar6;
              uVar7 = ((s->img_y + iVar3 * 8) - 1) / (uint)(iVar3 * 8);
              z->img_mcu_y = uVar7;
              local_68 = &z->img_comp[0].coeff_h;
              while( true ) {
                if (s->img_n <= lVar10) {
                  return 1;
                }
                local_68[-0x10] = (s->img_x * local_68[-0x16] + (uVar4 - 1)) / uVar4;
                local_68[-0xf] = (int)((s->img_y * local_68[-0x15] + iVar3 + -1) / uVar13);
                iVar15 = local_68[-0x16] * uVar6;
                a = iVar15 * 8;
                local_68[-0xe] = a;
                iVar11 = local_68[-0x15] * uVar7;
                b = iVar11 * 8;
                local_68[-0xd] = b;
                pvVar8 = stbi__malloc_mad2(a,b,0xf);
                *(short **)(local_68 + -3) = (short *)0x0;
                *(void **)(local_68 + -7) = (void *)0x0;
                *(stbi_uc **)(local_68 + -5) = (stbi_uc *)0x0;
                *(void **)(local_68 + -9) = pvVar8;
                why = extraout_EDX;
                if (pvVar8 == (void *)0x0) break;
                *(stbi_uc **)(local_68 + -0xb) =
                     (stbi_uc *)((long)pvVar8 + 0xfU & 0xfffffffffffffff0);
                if (z->progressive != 0) {
                  local_68[-1] = iVar15;
                  *local_68 = iVar11;
                  pvVar8 = stbi__malloc_mad3(a,b,2,0xf);
                  *(void **)(local_68 + -7) = pvVar8;
                  why = extraout_EDX_00;
                  if (pvVar8 == (void *)0x0) break;
                  *(short **)(local_68 + -3) = (short *)((long)pvVar8 + 0xfU & 0xfffffffffffffff0);
                }
                lVar10 = lVar10 + 1;
                local_68 = local_68 + 0x18;
              }
              *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
              stbi__free_jpeg_components(z,(int)lVar10 + 1,why);
              return 0;
            }
            if ((int)uVar4 % *(int *)((long)&z->img_comp[1].h + lVar10) != 0) goto LAB_0014ed28;
            piVar12 = (int *)((long)&z->img_comp[1].v + lVar10);
            lVar10 = lVar10 + 0x60;
            if (iVar3 % *piVar12 != 0) {
LAB_0014ed10:
              lVar10 = *in_FS_OFFSET;
              pcVar9 = "bad V";
              goto LAB_0014ea5b;
            }
          } while( true );
        }
        goto LAB_0014ea98;
      }
    }
    lVar10 = *in_FS_OFFSET;
    pcVar9 = "bad component count";
  }
  goto LAB_0014ea5b;
code_r0x0014ec51:
  lVar10 = *in_FS_OFFSET;
  pcVar9 = "bad TQ";
  goto LAB_0014ea5b;
LAB_0014ed28:
  lVar10 = *in_FS_OFFSET;
  pcVar9 = "bad H";
LAB_0014ea5b:
  *(char **)(lVar10 + -0x20) = pcVar9;
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}